

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

adt_error_t adt_ary_push_unique(adt_ary_t *self,void *pElem)

{
  void **ppvVar1;
  int iVar2;
  adt_error_t aVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  uVar5 = 0;
  uVar4 = (ulong)(uint)self->s32CurLen;
  if (self->s32CurLen < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      if (self == (adt_ary_t *)0x0) {
        aVar3 = '\x01';
      }
      else {
        iVar2 = self->s32CurLen;
        if ((long)iVar2 == 0x7fffffff) {
          __assert_fail("self->s32CurLen < INT32_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                        ,0xaa,"adt_error_t adt_ary_push(adt_ary_t *, void *)");
        }
        aVar3 = adt_ary_extend(self,iVar2 + 1);
        if (aVar3 == '\0') {
          self->pFirst[iVar2] = pElem;
          aVar3 = '\0';
        }
      }
      return aVar3;
    }
    ppvVar1 = self->pFirst + uVar5;
    uVar5 = uVar5 + 1;
  } while (*ppvVar1 != pElem);
  return '\0';
}

Assistant:

adt_error_t adt_ary_push_unique(adt_ary_t *self, void *pElem){
   if (self != 0)
   {
      int32_t s32Index;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem){
            return ADT_NO_ERROR;
         }
      }
      return adt_ary_push(self, pElem);
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}